

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

CodeLocation __thiscall
soul::CodeLocation::createFromString(CodeLocation *this,string *filename,string *text)

{
  UTF8Reader extraout_RDX;
  CodeLocation CVar1;
  string local_70;
  string local_50;
  undefined1 local_30 [24];
  string *text_local;
  string *filename_local;
  CodeLocation *code;
  
  local_30[0xf] = 0;
  local_30._16_8_ = text;
  text_local = filename;
  filename_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)filename);
  std::__cxx11::string::string((string *)&local_70,(string *)text);
  SourceCodeText::createForFile((SourceCodeText *)local_30,&local_50,&local_70);
  CodeLocation(this,(Ptr *)local_30);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  validateUTF8(this);
  CVar1.location.data = extraout_RDX.data;
  CVar1.sourceCode.object = (SourceCodeText *)this;
  return CVar1;
}

Assistant:

CodeLocation CodeLocation::createFromString (std::string filename, std::string text)
{
    CodeLocation code (SourceCodeText::createForFile (std::move (filename), std::move (text)));
    code.validateUTF8();
    return code;
}